

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffReporter.cpp
# Opt level: O1

void __thiscall ApprovalTests::DiffReporter::DiffReporter(DiffReporter *this)

{
  Reporter *pRVar1;
  MacDiffReporter *this_00;
  LinuxDiffReporter *this_01;
  WindowsDiffReporter *this_02;
  CrossPlatformDiffReporter *this_03;
  initializer_list<ApprovalTests::Reporter_*> __l;
  allocator_type local_51;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> local_50;
  Reporter *local_38;
  MacDiffReporter *local_30;
  LinuxDiffReporter *local_28;
  WindowsDiffReporter *local_20;
  CrossPlatformDiffReporter *local_18;
  
  pRVar1 = (Reporter *)operator_new(0x38);
  pRVar1->_vptr_Reporter = (_func_int **)0x0;
  pRVar1[1]._vptr_Reporter = (_func_int **)0x0;
  pRVar1[2]._vptr_Reporter = (_func_int **)0x0;
  pRVar1[3]._vptr_Reporter = (_func_int **)0x0;
  pRVar1[4]._vptr_Reporter = (_func_int **)0x0;
  pRVar1[5]._vptr_Reporter = (_func_int **)0x0;
  pRVar1[6]._vptr_Reporter = (_func_int **)0x0;
  pRVar1->_vptr_Reporter = (_func_int **)&PTR__EnvironmentVariableReporter_0015c780;
  ReporterFactory::ReporterFactory((ReporterFactory *)(pRVar1 + 1));
  local_38 = pRVar1;
  this_00 = (MacDiffReporter *)operator_new(0x20);
  Mac::MacDiffReporter::MacDiffReporter(this_00);
  local_30 = this_00;
  this_01 = (LinuxDiffReporter *)operator_new(0x20);
  Linux::LinuxDiffReporter::LinuxDiffReporter(this_01);
  local_28 = this_01;
  this_02 = (WindowsDiffReporter *)operator_new(0x20);
  Windows::WindowsDiffReporter::WindowsDiffReporter(this_02);
  local_20 = this_02;
  this_03 = (CrossPlatformDiffReporter *)operator_new(0x20);
  CrossPlatform::CrossPlatformDiffReporter::CrossPlatformDiffReporter(this_03);
  __l._M_len = 5;
  __l._M_array = &local_38;
  local_18 = this_03;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (&local_50,__l,&local_51);
  FirstWorkingReporter::FirstWorkingReporter(&this->super_FirstWorkingReporter,&local_50);
  if (local_50.
      super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_FirstWorkingReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__FirstWorkingReporter_0015c740;
  return;
}

Assistant:

DiffReporter::DiffReporter()
        : FirstWorkingReporter({new EnvironmentVariableReporter(),
                                new Mac::MacDiffReporter(),
                                new Linux::LinuxDiffReporter(),
                                new Windows::WindowsDiffReporter(),
                                new CrossPlatform::CrossPlatformDiffReporter()})
    {
    }